

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternative.hpp
# Opt level: O0

type __thiscall
boost::spirit::classic::
alternative<boost::spirit::classic::alnum_parser,boost::spirit::classic::chlit<char>>::
parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::no_skipper_iteration_policy<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
          (alternative<boost::spirit::classic::alnum_parser,_boost::spirit::classic::chlit<char>_>
           *this,scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::no_skipper_iteration_policy<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>_>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
                 *scan)

{
  bool_type bVar1;
  iterator_t save;
  result_t hit;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffff28;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffff30;
  match<boost::spirit::classic::nil_t> *this_00;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffff48;
  match<boost::spirit::classic::nil_t> in_stack_ffffffffffffff50;
  scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::no_skipper_iteration_policy<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>_>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
  *in_stack_ffffffffffffffc0;
  char_parser<boost::spirit::classic::chlit<char>_> *in_stack_ffffffffffffffc8;
  ptrdiff_t local_8;
  
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator((position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                       *)in_stack_ffffffffffffff50.len,in_stack_ffffffffffffff48);
  binary<boost::spirit::classic::alnum_parser,_boost::spirit::classic::chlit<char>,_boost::spirit::classic::parser<boost::spirit::classic::alternative<boost::spirit::classic::alnum_parser,_boost::spirit::classic::chlit<char>_>_>_>
  ::left((binary<boost::spirit::classic::alnum_parser,_boost::spirit::classic::chlit<char>,_boost::spirit::classic::parser<boost::spirit::classic::alternative<boost::spirit::classic::alnum_parser,_boost::spirit::classic::chlit<char>_>_>_>
          *)0xa24ee4);
  char_parser<boost::spirit::classic::alnum_parser>::
  parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::no_skipper_iteration_policy<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
            ((char_parser<boost::spirit::classic::alnum_parser> *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  match<boost::spirit::classic::nil_t>::match<char>
            ((match<boost::spirit::classic::nil_t> *)in_stack_ffffffffffffff30,
             (match<char> *)in_stack_ffffffffffffff28);
  match<char>::~match((match<char> *)0xa24f22);
  bVar1 = safe_bool::operator_cast_to__
                    ((safe_bool<boost::spirit::classic::match<boost::spirit::classic::nil_t>,_boost::spirit::classic::impl::no_base<boost::spirit::classic::match<boost::spirit::classic::nil_t>_>_>
                      *)0xa24f2f);
  if (bVar1 == 0xffffffffffffffff) {
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(in_stack_ffffffffffffff30);
  if (bVar1 == 0xffffffffffffffff) {
    binary<boost::spirit::classic::alnum_parser,_boost::spirit::classic::chlit<char>,_boost::spirit::classic::parser<boost::spirit::classic::alternative<boost::spirit::classic::alnum_parser,_boost::spirit::classic::chlit<char>_>_>_>
    ::right((binary<boost::spirit::classic::alnum_parser,_boost::spirit::classic::chlit<char>,_boost::spirit::classic::parser<boost::spirit::classic::alternative<boost::spirit::classic::alnum_parser,_boost::spirit::classic::chlit<char>_>_>_>
             *)0xa24fb8);
    this_00 = (match<boost::spirit::classic::nil_t> *)&stack0xffffffffffffff50;
    char_parser<boost::spirit::classic::chlit<char>>::
    parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::no_skipper_iteration_policy<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    match<boost::spirit::classic::nil_t>::match<char>
              (this_00,(match<char> *)in_stack_ffffffffffffff28);
    match<char>::~match((match<char> *)0xa24ff0);
  }
  return (type)local_8;
}

Assistant:

typename parser_result<self_t, ScannerT>::type
        parse(ScannerT const& scan) const
        {
            typedef typename parser_result<self_t, ScannerT>::type result_t;
            typedef typename ScannerT::iterator_t iterator_t;
            { // scope for save
                iterator_t save = scan.first;
                if (result_t hit = this->left().parse(scan))
                    return hit;
                scan.first = save;
            }
            return this->right().parse(scan);
        }